

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

void __thiscall picojson::value::value(value *this,value *x)

{
  int iVar1;
  string *psVar2;
  value *x_local;
  value *this_local;
  
  this->type_ = x->type_;
  iVar1 = this->type_;
  if (iVar1 == 3) {
    psVar2 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)psVar2,(string *)(x->u_).string_);
    (this->u_).string_ = psVar2;
  }
  else if (iVar1 == 4) {
    psVar2 = (string *)operator_new(0x18);
    std::vector<picojson::value,_std::allocator<picojson::value>_>::vector
              ((vector<picojson::value,_std::allocator<picojson::value>_> *)psVar2,
               (vector<picojson::value,_std::allocator<picojson::value>_> *)(x->u_).string_);
    (this->u_).string_ = psVar2;
  }
  else if (iVar1 == 5) {
    psVar2 = (string *)operator_new(0x30);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
           *)psVar2,
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
           *)(x->u_).string_);
    (this->u_).string_ = psVar2;
  }
  else {
    this->u_ = x->u_;
  }
  return;
}

Assistant:

inline value::value(const value& x) : type_(x.type_) {
    switch (type_) {
#define INIT(p, v) case p##type: u_.p = v; break
      INIT(string_, new std::string(*x.u_.string_));
      INIT(array_, new array(*x.u_.array_));
      INIT(object_, new object(*x.u_.object_));
#undef INIT
    default:
      u_ = x.u_;
      break;
    }
  }